

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_begin_image_text(nk_context *ctx,char *selected,int len,nk_image img,nk_vec2 size)

{
  nk_vec2 nVar1;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_00;
  nk_rect header_00;
  nk_rect r_01;
  nk_rect b;
  nk_widget_layout_states nVar2;
  int iVar3;
  long in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float is_clicked_00;
  nk_symbol_type sym;
  nk_rect image;
  nk_rect label;
  nk_rect button;
  nk_rect content;
  nk_text text;
  nk_style_item *background;
  nk_widget_layout_states s;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  nk_context *ctx_00;
  nk_command_buffer *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  nk_color c;
  undefined4 in_stack_fffffffffffffe88;
  nk_symbol_type in_stack_fffffffffffffe8c;
  nk_style_button *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  nk_flags state;
  nk_rect *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  nk_button_behavior in_stack_fffffffffffffeac;
  float fVar9;
  undefined4 in_stack_fffffffffffffeb0;
  float fVar10;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  float a;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  float fVar12;
  float len_00;
  float fVar13;
  float fVar14;
  float fVar15;
  int *local_60;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  int local_4;
  
  c = SUB84((ulong)in_stack_fffffffffffffe80 >> 0x20,0);
  state = (nk_flags)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  ctx_00 = (nk_context *)&stack0x00000008;
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x3fc8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x3fc8) + 0xa0) == 0)) {
    local_4 = 0;
  }
  else {
    nVar2 = nk_widget((nk_rect *)in_stack_fffffffffffffe78,ctx_00);
    if (nVar2 == NK_WIDGET_INVALID) {
      local_4 = 0;
    }
    else {
      r_01.y = in_stack_fffffffffffffec8;
      r_01.x = (float)in_stack_fffffffffffffec4;
      r_01.w = in_stack_fffffffffffffecc;
      r_01.h = in_stack_fffffffffffffed0;
      iVar3 = nk_button_behavior((nk_flags *)
                                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),r_01,
                                 (nk_input *)
                                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                 in_stack_fffffffffffffeac);
      if ((*(uint *)(in_RDI + 0x1f50) & 0x20) == 0) {
        if ((*(uint *)(in_RDI + 0x1f50) & 0x10) == 0) {
          local_60 = (int *)(in_RDI + 0x1a98);
        }
        else {
          local_60 = (int *)(in_RDI + 0x1ab8);
        }
      }
      else {
        local_60 = (int *)(in_RDI + 0x1ad8);
      }
      if (*local_60 == 1) {
        nk_rgba(0,0,0,0);
        r.y = (float)in_stack_fffffffffffffe8c;
        r.x = (float)in_stack_fffffffffffffe88;
        r._8_8_ = in_stack_fffffffffffffe90;
        nk_draw_image(in_stack_fffffffffffffe78,r,(nk_image *)ctx_00,c);
      }
      else {
        rect.y = (float)in_stack_fffffffffffffe8c;
        rect.x = (float)in_stack_fffffffffffffe88;
        rect._8_8_ = in_stack_fffffffffffffe90;
        nk_fill_rect(in_stack_fffffffffffffe78,rect,(float)((ulong)ctx_00 >> 0x20),c);
        rect_00.y = (float)in_stack_fffffffffffffe8c;
        rect_00.x = (float)in_stack_fffffffffffffe88;
        rect_00._8_8_ = in_stack_fffffffffffffe90;
        nk_stroke_rect(in_stack_fffffffffffffe78,rect_00,(float)((ulong)ctx_00 >> 0x20),
                       SUB84(ctx_00,0),c);
      }
      if ((*(uint *)(in_RDI + 0x1f50) & 0x10) == 0) {
        if (iVar3 == 0) {
          fVar12 = *(float *)(in_RDI + 0x1bc8);
        }
        else {
          fVar12 = *(float *)(in_RDI + 0x1bd0);
        }
      }
      else {
        fVar12 = *(float *)(in_RDI + 0x1bcc);
      }
      fVar4 = ((local_50 + fStack_48) - fStack_44) - *(float *)(in_RDI + 0x1be4);
      nk_draw_button_symbol
                ((nk_command_buffer *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (nk_rect *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea0,state,in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c
                 ,(nk_user_font *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      fVar5 = local_50 + *(float *)(in_RDI + 0x1bdc);
      fVar6 = fStack_4c + *(float *)(in_RDI + 0x1be0);
      fVar7 = fStack_44 - (*(float *)(in_RDI + 0x1be0) + *(float *)(in_RDI + 0x1be0));
      uVar11 = 0xffffffff;
      r_00.y = (float)in_stack_fffffffffffffe8c;
      r_00.x = (float)in_stack_fffffffffffffe88;
      r_00._8_8_ = in_stack_fffffffffffffe90;
      a = fVar7;
      len_00 = fVar5;
      fVar13 = fVar6;
      fVar14 = fVar7;
      fVar15 = fVar7;
      nk_draw_image(in_stack_fffffffffffffe78,r_00,(nk_image *)ctx_00,c);
      nVar1 = nk_vec2(0.0,0.0);
      fVar9 = nVar1.x;
      fVar10 = nVar1.y;
      fVar8 = len_00 + fVar14 + *(float *)(in_RDI + 0x1bec) + *(float *)(in_RDI + 0x1bdc);
      is_clicked_00 = fStack_44 - (*(float *)(in_RDI + 0x1be0) + *(float *)(in_RDI + 0x1be0));
      b.y = (fVar4 - *(float *)(in_RDI + 0x1bdc)) - fVar8;
      b.x = fStack_4c + *(float *)(in_RDI + 0x1be0);
      b.w = is_clicked_00;
      b.h = fVar4;
      nk_widget_text((nk_command_buffer *)CONCAT44(fVar8,fVar15),b,(char *)CONCAT44(fVar14,fVar13),
                     (int)len_00,
                     (nk_text *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (nk_flags)a,(nk_user_font *)CONCAT44(fVar6,fVar5));
      nVar1.y = fVar12;
      nVar1.x = in_stack_fffffffffffffecc;
      header_00.y = fVar7;
      header_00.x = fVar6;
      header_00.w = a;
      header_00.h = in_stack_fffffffffffffec8;
      local_4 = nk_combo_begin((nk_context *)CONCAT44(uVar11,fVar10),
                               (nk_window *)CONCAT44(fVar9,in_stack_fffffffffffffea8),nVar1,
                               (int)is_clicked_00,header_00);
    }
  }
  return local_4;
}

Assistant:

NK_API int
nk_combo_begin_image_text(struct nk_context *ctx, const char *selected, int len,
    struct nk_image img, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (!s) return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect label;
        struct nk_rect image;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);

        /* draw image */
        image.x = header.x + style->combo.content_padding.x;
        image.y = header.y + style->combo.content_padding.y;
        image.h = header.h - 2 * style->combo.content_padding.y;
        image.w = image.h;
        nk_draw_image(&win->buffer, image, &img, nk_white);

        /* draw label */
        text.padding = nk_vec2(0,0);
        label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = (button.x - style->combo.content_padding.x) - label.x;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}